

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void recfield(LexState *ls,ConsControl *cc)

{
  lu_byte lVar1;
  FuncState *fs;
  expdesc *peVar2;
  expdesc key;
  expdesc tab;
  expdesc val;
  expdesc local_70;
  expdesc local_58;
  expdesc local_40;
  
  fs = ls->fs;
  lVar1 = fs->freereg;
  if ((ls->t).token == 0x123) {
    if (0x3fffffff < cc->nh) {
      recfield_cold_1();
    }
    local_70.u.strval = str_checkname(ls);
    local_70.t = -1;
    local_70.f = -1;
    local_70.k = VKSTR;
  }
  else {
    yindex(ls,&local_70);
  }
  cc->nh = cc->nh + 1;
  checknext(ls,0x3d);
  peVar2 = cc->t;
  local_58.t = peVar2->t;
  local_58.f = peVar2->f;
  local_58.k = peVar2->k;
  local_58._4_4_ = *(undefined4 *)&peVar2->field_0x4;
  local_58.u = peVar2->u;
  luaK_indexed(fs,&local_58,&local_70);
  subexpr(ls,&local_40,0);
  luaK_storevar(fs,&local_58,&local_40);
  fs->freereg = lVar1;
  return;
}

Assistant:

static void recfield (LexState *ls, ConsControl *cc) {
  /* recfield -> (NAME | '['exp']') = exp */
  FuncState *fs = ls->fs;
  lu_byte reg = ls->fs->freereg;
  expdesc tab, key, val;
  if (ls->t.token == TK_NAME) {
    luaY_checklimit(fs, cc->nh, INT_MAX / 2, "items in a constructor");
    codename(ls, &key);
  }
  else  /* ls->t.token == '[' */
    yindex(ls, &key);
  cc->nh++;
  checknext(ls, '=');
  tab = *cc->t;
  luaK_indexed(fs, &tab, &key);
  expr(ls, &val);
  luaK_storevar(fs, &tab, &val);
  fs->freereg = reg;  /* free registers */
}